

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pcVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  CacheEntryType CVar6;
  long lVar7;
  char *__s;
  ostream *poVar8;
  string *psVar9;
  string *key;
  size_type sVar10;
  pointer pbVar11;
  _Alloc_hider _Var12;
  uint uVar13;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  string entryPattern;
  CacheEntryType type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string arg;
  string path;
  undefined1 local_198 [40];
  string local_170;
  CacheEntryType local_14c;
  undefined1 local_148 [17];
  undefined7 uStack_137;
  ulong local_128;
  long *local_120;
  long local_118;
  long local_110 [2];
  undefined1 local_100 [184];
  char *local_48;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar4 = true;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
    uVar14 = 1;
    local_128 = 0;
    do {
      local_120 = local_110;
      pcVar1 = pbVar11[uVar14]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar1,pcVar1 + pbVar11[uVar14]._M_string_length);
      lVar7 = std::__cxx11::string::find((char *)&local_120,0x5afceb,0);
      uVar13 = (uint)uVar14;
      if (lVar7 == 0) {
        std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
        if ((char *)local_100._8_8_ == (char *)0x0) {
          uVar13 = uVar13 + 1;
          if ((ulong)uVar13 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)local_100);
            goto LAB_0037ef47;
          }
          bVar4 = false;
          cmSystemTools::Error
                    ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
LAB_0037ef47:
          local_170._M_string_length = 0;
          local_170.field_2._M_local_buf[0] = '\0';
          local_198._0_8_ = local_198 + 0x10;
          local_198._8_8_ = (string *)0x0;
          local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
          local_14c = UNINITIALIZED;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          bVar4 = cmCacheManager::ParseEntry
                            ((string *)local_100,&local_170,(string *)local_198,&local_14c);
          if (bVar4) {
            local_148._0_8_ = local_148 + 0x10;
            local_148._8_8_ = (string *)0x0;
            local_148[0x10] = 0;
            if ((this->WarnUnusedCli == true) &&
               (__s = cmState::GetInitializedCacheValue(this->State,&local_170),
               uVar3 = local_148._8_8_, __s != (char *)0x0)) {
              strlen(__s);
              bVar2 = true;
              std::__cxx11::string::_M_replace((ulong)local_148,0,(char *)uVar3,(ulong)__s);
            }
            else {
              bVar2 = false;
            }
            cmState::AddCacheEntry
                      (this->State,&local_170,(char *)local_198._0_8_,
                       "No help, variable specified on the command line.",local_14c);
            if (this->WarnUnusedCli == true) {
              if (bVar2) {
                cmState::GetInitializedCacheValue(this->State,&local_170);
                iVar5 = std::__cxx11::string::compare(local_148);
                if (iVar5 == 0) goto LAB_0037f0fe;
              }
              WatchUnusedCli(this,&local_170);
            }
LAB_0037f0fe:
            if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_,CONCAT71(uStack_137,local_148[0x10]) + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Parse error in command line argument: ",0x26);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_120,local_118);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"Should be: VAR:type=value\n",0x1a);
            cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          }
          if ((string *)local_198._0_8_ != (string *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,
                            CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                     local_170.field_2._M_local_buf[0]) + 1);
          }
        }
LAB_0037f2dc:
        sVar10 = local_100._16_8_;
        _Var12._M_p = (pointer)local_100._0_8_;
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_0037f2f9:
          operator_delete(_Var12._M_p,sVar10 + 1);
        }
LAB_0037f301:
        if (bVar4 != false) goto LAB_0037f4e8;
LAB_0037f309:
        bVar4 = false;
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)&local_120,0x59c302,0);
        if (lVar7 == 0) {
          this->SuppressDevWarnings = true;
          this->DoSuppressDevWarnings = true;
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)&local_120,0x59c30b,0);
          if (lVar7 != 0) {
            lVar7 = std::__cxx11::string::find((char *)&local_120,0x58500b,0);
            if (lVar7 == 0) {
              std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_120);
              if (local_170._M_string_length == 0) {
                uVar13 = uVar13 + 1;
                if ((ulong)uVar13 <
                    (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                  std::__cxx11::string::_M_assign((string *)&local_170);
                  goto LAB_0037f1af;
                }
                bVar4 = false;
                cmSystemTools::Error
                          ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
              }
              else {
LAB_0037f1af:
                cmsys::Glob::PatternToRegex((string *)local_198,&local_170,true,true);
                local_48 = (char *)0x0;
                if ((string *)local_198._0_8_ == (string *)0x0) {
                  psVar9 = (string *)0x0;
LAB_0037f38c:
                  operator_delete(psVar9,local_198._16_8_ + 1);
                }
                else {
                  cmsys::RegularExpression::compile
                            ((RegularExpression *)local_100,(char *)local_198._0_8_);
                  psVar9 = (string *)local_198._0_8_;
                  if ((string *)local_198._0_8_ != (string *)(local_198 + 0x10)) goto LAB_0037f38c;
                }
                local_198._0_8_ = (string *)0x0;
                local_198._8_8_ = (string *)0x0;
                local_198._16_8_ = 0;
                cmState::GetCacheEntryKeys_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_148,this->State);
                for (psVar9 = (string *)local_148._0_8_; key = (string *)local_198._0_8_,
                    psVar9 != (string *)local_148._8_8_; psVar9 = psVar9 + 1) {
                  CVar6 = cmState::GetCacheEntryType(this->State,psVar9);
                  if ((CVar6 != STATIC) &&
                     (bVar4 = cmsys::RegularExpression::find
                                        ((RegularExpression *)local_100,(psVar9->_M_dataplus)._M_p),
                     bVar4)) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_198,psVar9);
                  }
                }
                for (; key != (string *)local_198._8_8_; key = key + 1) {
                  cmState::RemoveCacheEntry(this->State,key);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_198);
                if (local_48 != (char *)0x0) {
                  operator_delete__(local_48);
                }
                bVar4 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                sVar10 = CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                  local_170.field_2._M_local_buf[0]);
                _Var12._M_p = local_170._M_dataplus._M_p;
                goto LAB_0037f2f9;
              }
              goto LAB_0037f301;
            }
            lVar7 = std::__cxx11::string::find((char *)&local_120,0x584f73,0);
            if (lVar7 == 0) {
              std::__cxx11::string::substr((ulong)local_100,(ulong)&local_120);
              if ((char *)local_100._8_8_ == (char *)0x0) {
                uVar13 = uVar13 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar13)
                {
                  bVar4 = false;
                  cmSystemTools::Error
                            ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,
                             (char *)0x0);
                  goto LAB_0037f2dc;
                }
                std::__cxx11::string::_M_assign((string *)local_100);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"loading initial cache file ",0x1b);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_100._0_8_,local_100._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              bVar4 = true;
              ReadListFile(this,args,(char *)local_100._0_8_);
              goto LAB_0037f2dc;
            }
            lVar7 = std::__cxx11::string::find((char *)&local_120,0x5919bf,0);
            if (lVar7 != 0) {
              lVar7 = std::__cxx11::string::find((char *)&local_120,0x59c393,0);
              local_128 = CONCAT71((int7)(local_128 >> 8),(byte)local_128 | lVar7 == 0);
              goto LAB_0037f4e8;
            }
            uVar13 = uVar13 + 1;
            uVar14 = (ulong)uVar13;
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (uVar14 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11
                                >> 5)) {
              local_100._0_8_ = local_100 + 0x10;
              pcVar1 = pbVar11[uVar14]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_100,pcVar1,pcVar1 + pbVar11[uVar14]._M_string_length);
              uVar3 = local_100._8_8_;
              if ((char *)local_100._8_8_ == (char *)0x0) {
                cmSystemTools::Error
                          ("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
              }
              else {
                ReadListFile(this,args,(char *)local_100._0_8_);
              }
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
              }
              if ((char *)uVar3 != (char *)0x0) goto LAB_0037f4e8;
              goto LAB_0037f309;
            }
            bVar4 = false;
            cmSystemTools::Error
                      ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
            goto LAB_0037f4ea;
          }
          this->SuppressDevWarnings = false;
          this->DoSuppressDevWarnings = true;
        }
LAB_0037f4e8:
        bVar4 = true;
      }
LAB_0037f4ea:
      if (local_120 != local_110) {
        operator_delete(local_120,local_110[0] + 1);
      }
      if (!bVar4) {
        return false;
      }
      uVar14 = (ulong)(uVar13 + 1);
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                             ));
    bVar4 = true;
    if ((local_128 & 1) != 0) {
      bVar4 = FindPackage(this,args);
    }
  }
  return bVar4;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmCacheManager::ParseEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->State->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      this->SuppressDevWarnings = true;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      this->SuppressDevWarnings = false;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}